

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

QList<QRect> * __thiscall QList<QRect>::fill(QList<QRect> *this,parameter_type t,qsizetype newSize)

{
  undefined8 *puVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  QRect *pQVar9;
  QRect *pQVar10;
  long lVar11;
  long lVar12;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSize == -1) {
    newSize = (this->d).size;
  }
  pDVar2 = (this->d).d;
  lVar12 = newSize;
  if (pDVar2 != (Data *)0x0) {
    lVar12 = (pDVar2->super_QArrayData).alloc;
    if (newSize <= lVar12 &&
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
      iVar4 = (t->x1).m_i;
      iVar5 = (t->y1).m_i;
      iVar6 = (t->x2).m_i;
      iVar7 = (t->y2).m_i;
      lVar12 = (this->d).size;
      lVar11 = newSize;
      if (lVar12 < newSize) {
        lVar11 = lVar12;
      }
      if (lVar11 != 0) {
        pQVar10 = (this->d).ptr;
        lVar12 = 0;
        do {
          uVar8 = *(undefined8 *)&t->x2;
          puVar1 = (undefined8 *)((long)&(pQVar10->x1).m_i + lVar12);
          *puVar1 = *(undefined8 *)t;
          puVar1[1] = uVar8;
          lVar12 = lVar12 + 0x10;
        } while (lVar11 * 0x10 != lVar12);
        lVar12 = (this->d).size;
      }
      if (lVar12 < newSize) {
        if (newSize != lVar12) {
          pQVar10 = (this->d).ptr;
          lVar11 = lVar12 - newSize;
          do {
            pQVar9 = pQVar10 + lVar12;
            (pQVar9->x1).m_i = iVar4;
            (pQVar9->y1).m_i = iVar5;
            (pQVar9->x2).m_i = iVar6;
            (pQVar9->y2).m_i = iVar7;
            lVar12 = (this->d).size + 1;
            (this->d).size = lVar12;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0);
        }
      }
      else if (newSize < lVar12) {
        (this->d).size = newSize;
      }
      goto LAB_0045fde4;
    }
    if (lVar12 <= newSize) {
      lVar12 = newSize;
    }
    if (((pDVar2->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
      lVar12 = newSize;
    }
  }
  local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar9 = (QRect *)QArrayData::allocate(&local_30,0x10,0x10,lVar12,KeepSize);
  pQVar10 = pQVar9;
  for (lVar12 = newSize; lVar12 != 0; lVar12 = lVar12 + -1) {
    iVar4 = (t->y1).m_i;
    iVar5 = (t->x2).m_i;
    iVar6 = (t->y2).m_i;
    (pQVar10->x1).m_i = (t->x1).m_i;
    (pQVar10->y1).m_i = iVar4;
    (pQVar10->x2).m_i = iVar5;
    (pQVar10->y2).m_i = iVar6;
    pQVar10 = pQVar10 + 1;
  }
  pQVar3 = &((this->d).d)->super_QArrayData;
  (this->d).d = (Data *)local_30;
  (this->d).ptr = pQVar9;
  (this->d).size = newSize;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,0x10,0x10);
    }
  }
LAB_0045fde4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}